

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cpp
# Opt level: O0

void __thiscall CFlow::Add(CFlow *this,vec2 Pos,vec2 Vel,float Size)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM0_Db;
  int y;
  int x;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) != 0) {
    iVar2 = (int)(in_XMM0_Da / (float)*(int *)(in_RDI + 0x20));
    iVar1 = (int)(in_XMM0_Db / (float)*(int *)(in_RDI + 0x20));
    if ((((-1 < iVar2) && (-1 < iVar1)) && (iVar2 < *(int *)(in_RDI + 0x1c))) &&
       (iVar1 < *(int *)(in_RDI + 0x18))) {
      vector2_base<float>::operator+=
                ((vector2_base<float> *)
                 (*(long *)(in_RDI + 0x10) + (long)(iVar1 * *(int *)(in_RDI + 0x1c) + iVar2) * 8),
                 &local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CFlow::Add(vec2 Pos, vec2 Vel, float Size)
{
	if(!m_pCells)
		return;

	int x = (int)(Pos.x / m_Spacing);
	int y = (int)(Pos.y / m_Spacing);
	if(x < 0 || y < 0 || x >= m_Width || y >= m_Height)
		return;

	m_pCells[y*m_Width+x].m_Vel += Vel;
}